

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdUnblindIssuance(void *handle,char *tx_hex_string,uint32_t tx_in_index,
                      char *asset_blinding_key,char *token_blinding_key,char **asset,
                      int64_t *asset_value,char **asset_blind_factor,char **asset_value_blind_factor
                      ,char **token,int64_t *token_value,char **token_blind_factor,
                      char **token_value_blind_factor)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t iVar5;
  char *pcVar6;
  char *pcVar7;
  CfdException *this;
  Amount AVar8;
  undefined1 local_260 [32];
  char *work_token_blind_factor;
  char *work_token;
  char *work_asset_value_blind_factor;
  char *work_asset_blind_factor;
  char *work_asset;
  void *local_218;
  undefined8 local_210;
  char **local_208;
  char *local_200;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> unblind_datas;
  Privkey token_key;
  Privkey asset_key;
  UnblindParameter unblind_asset;
  UnblindParameter unblind_token;
  ConfidentialTransactionController ctxc;
  
  work_asset = (char *)0x0;
  work_asset_blind_factor = (char *)0x0;
  work_asset_value_blind_factor = (char *)0x0;
  work_token = (char *)0x0;
  work_token_blind_factor = (char *)0x0;
  local_210 = 0;
  local_218 = handle;
  local_208 = asset;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&unblind_asset,tx_hex_string,(allocator *)&unblind_token)
    ;
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&ctxc,(string *)&unblind_asset);
    std::__cxx11::string::~string((string *)&unblind_asset);
    cfd::core::Privkey::Privkey(&asset_key);
    cfd::core::Privkey::Privkey(&token_key);
    bVar1 = cfd::capi::IsEmptyString(asset_blinding_key);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&unblind_token,asset_blinding_key,(allocator *)local_260);
      cfd::core::Privkey::Privkey((Privkey *)&unblind_asset,(string *)&unblind_token,kMainnet,true);
      cfd::core::Privkey::operator=(&asset_key,(Privkey *)&unblind_asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unblind_asset);
      std::__cxx11::string::~string((string *)&unblind_token);
    }
    bVar1 = cfd::capi::IsEmptyString(token_blinding_key);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&unblind_token,token_blinding_key,(allocator *)local_260);
      cfd::core::Privkey::Privkey((Privkey *)&unblind_asset,(string *)&unblind_token,kMainnet,true);
      cfd::core::Privkey::operator=(&token_key,(Privkey *)&unblind_asset);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unblind_asset);
      std::__cxx11::string::~string((string *)&unblind_token);
    }
    cfd::ConfidentialTransactionController::UnblindIssuance
              (&unblind_datas,&ctxc,tx_in_index,&asset_key,&token_key);
    cfd::core::UnblindParameter::UnblindParameter(&unblind_asset);
    cfd::core::UnblindParameter::UnblindParameter(&unblind_token);
    if ((long)unblind_datas.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)unblind_datas.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x120) {
      cfd::core::UnblindParameter::operator=
                (&unblind_asset,
                 unblind_datas.
                 super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cfd::core::UnblindParameter::operator=
                (&unblind_token,
                 unblind_datas.
                 super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&unblind_asset.asset);
    if (bVar1) {
      pcVar3 = (char *)0x0;
      pcVar2 = (char *)0x0;
      pcVar4 = (char *)0x0;
    }
    else {
      if (local_208 == (char **)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_260,&unblind_asset.asset);
        pcVar4 = cfd::capi::CreateString((string *)local_260);
        work_asset = pcVar4;
        std::__cxx11::string::~string((string *)local_260);
      }
      if (asset_value != (int64_t *)0x0) {
        AVar8 = cfd::core::ConfidentialValue::GetAmount(&unblind_asset.value);
        local_260._0_8_ = AVar8.amount_;
        local_260[8] = AVar8.ignore_check_;
        iVar5 = cfd::core::Amount::GetSatoshiValue((Amount *)local_260);
        *asset_value = iVar5;
      }
      if (asset_blind_factor == (char **)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_260,&unblind_asset.abf);
        pcVar2 = cfd::capi::CreateString((string *)local_260);
        work_asset_blind_factor = pcVar2;
        std::__cxx11::string::~string((string *)local_260);
      }
      if (asset_value_blind_factor == (char **)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_260,&unblind_asset.vbf);
        pcVar3 = cfd::capi::CreateString((string *)local_260);
        work_asset_value_blind_factor = pcVar3;
        std::__cxx11::string::~string((string *)local_260);
      }
    }
    local_200 = pcVar4;
    bVar1 = cfd::core::ConfidentialAssetId::IsEmpty(&unblind_token.asset);
    if (bVar1) {
      pcVar7 = (char *)0x0;
      pcVar6 = (char *)0x0;
      pcVar4 = (char *)0x0;
    }
    else {
      if (token == (char **)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_260,&unblind_token.asset);
        pcVar4 = cfd::capi::CreateString((string *)local_260);
        work_token = pcVar4;
        std::__cxx11::string::~string((string *)local_260);
      }
      if (token_value != (int64_t *)0x0) {
        AVar8 = cfd::core::ConfidentialValue::GetAmount(&unblind_token.value);
        local_260._0_8_ = AVar8.amount_;
        local_260[8] = AVar8.ignore_check_;
        iVar5 = cfd::core::Amount::GetSatoshiValue((Amount *)local_260);
        *token_value = iVar5;
      }
      if (token_blind_factor == (char **)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_260,&unblind_token.abf);
        pcVar6 = cfd::capi::CreateString((string *)local_260);
        work_token_blind_factor = pcVar6;
        std::__cxx11::string::~string((string *)local_260);
      }
      if (token_value_blind_factor == (char **)0x0) {
        pcVar7 = (char *)0x0;
      }
      else {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_260,&unblind_token.vbf);
        pcVar7 = cfd::capi::CreateString((string *)local_260);
        std::__cxx11::string::~string((string *)local_260);
      }
    }
    if (local_200 != (char *)0x0) {
      *local_208 = local_200;
    }
    if (pcVar2 != (char *)0x0) {
      *asset_blind_factor = pcVar2;
    }
    if (pcVar3 != (char *)0x0) {
      *asset_value_blind_factor = pcVar3;
    }
    if (pcVar4 != (char *)0x0) {
      *token = pcVar4;
    }
    if (pcVar6 != (char *)0x0) {
      *token_blind_factor = pcVar6;
    }
    if (pcVar7 != (char *)0x0) {
      *token_value_blind_factor = pcVar7;
    }
    cfd::core::UnblindParameter::~UnblindParameter(&unblind_token);
    cfd::core::UnblindParameter::~UnblindParameter(&unblind_asset);
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
              (&unblind_datas);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&token_key);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_key);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
    return 0;
  }
  unblind_asset.asset._vptr_ConfidentialAssetId = (_func_int **)0x4fbb12;
  unblind_asset.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7d8;
  unblind_asset.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdUnblindIssuance";
  cfd::core::logger::warn<>((CfdSourceLocation *)&unblind_asset,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&unblind_asset,"Failed to parameter. tx is null or empty.",
             (allocator *)&unblind_token);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&unblind_asset);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUnblindIssuance(
    void* handle, const char* tx_hex_string, uint32_t tx_in_index,
    const char* asset_blinding_key, const char* token_blinding_key,
    char** asset, int64_t* asset_value, char** asset_blind_factor,
    char** asset_value_blind_factor, char** token, int64_t* token_value,
    char** token_blind_factor, char** token_value_blind_factor) {
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_asset_value_blind_factor = nullptr;
  char* work_token = nullptr;
  char* work_token_blind_factor = nullptr;
  char* work_token_value_blind_factor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    Privkey asset_key;
    Privkey token_key;
    if (!IsEmptyString(asset_blinding_key)) {
      asset_key = Privkey(asset_blinding_key);
    }
    if (!IsEmptyString(token_blinding_key)) {
      token_key = Privkey(token_blinding_key);
    }

    std::vector<UnblindParameter> unblind_datas =
        ctxc.UnblindIssuance(tx_in_index, asset_key, token_key);

    UnblindParameter unblind_asset;
    UnblindParameter unblind_token;
    if (unblind_datas.size() == 2) {  // 2固定
      unblind_asset = unblind_datas[0];
      unblind_token = unblind_datas[1];
    }

    if (!unblind_asset.asset.IsEmpty()) {
      if (asset != nullptr) {
        work_asset = CreateString(unblind_asset.asset.GetHex());
      }
      if (asset_value != nullptr) {
        *asset_value = unblind_asset.value.GetAmount().GetSatoshiValue();
      }
      if (asset_blind_factor != nullptr) {
        work_asset_blind_factor = CreateString(unblind_asset.abf.GetHex());
      }
      if (asset_value_blind_factor != nullptr) {
        work_asset_value_blind_factor =
            CreateString(unblind_asset.vbf.GetHex());
      }
    }
    if (!unblind_token.asset.IsEmpty()) {
      if (token != nullptr) {
        work_token = CreateString(unblind_token.asset.GetHex());
      }
      if (token_value != nullptr) {
        *token_value = unblind_token.value.GetAmount().GetSatoshiValue();
      }
      if (token_blind_factor != nullptr) {
        work_token_blind_factor = CreateString(unblind_token.abf.GetHex());
      }
      if (token_value_blind_factor != nullptr) {
        work_token_value_blind_factor =
            CreateString(unblind_token.vbf.GetHex());
      }
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_asset_value_blind_factor != nullptr)
      *asset_value_blind_factor = work_asset_value_blind_factor;
    if (work_token != nullptr) *token = work_token;
    if (work_token_blind_factor != nullptr)
      *token_blind_factor = work_token_blind_factor;
    if (work_token_value_blind_factor != nullptr)
      *token_value_blind_factor = work_token_value_blind_factor;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}